

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

char * __thiscall amrex::BaseFab<char>::dataPtr(BaseFab<char> *this,int n)

{
  Long LVar1;
  char *pcVar2;
  
  pcVar2 = this->dptr;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    LVar1 = Box::numPts(&this->domain);
    pcVar2 = pcVar2 + LVar1 * n;
  }
  return pcVar2;
}

Assistant:

const T* dataPtr (int n = 0) const noexcept {
        if (this->dptr) {
            return &(this->dptr[n*this->domain.numPts()]);
        } else {
            return nullptr;
        }
    }